

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void sha512_add(sha512 *ctx,uint8_t *data,size_t len)

{
  uint8_t uVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  
  uVar2 = ctx->fill;
  if (uVar2 != 0) {
    bVar4 = uVar2 < 0x80;
    sVar3 = len;
    if (len != 0 && bVar4) {
      do {
        uVar1 = *data;
        data = data + 1;
        ctx->fill = uVar2 + 1;
        ctx->buffer[uVar2] = uVar1;
        len = sVar3 - 1;
        uVar2 = ctx->fill;
        bVar4 = uVar2 < 0x80;
        if (!bVar4) break;
        bVar5 = sVar3 != 1;
        sVar3 = len;
      } while (bVar5);
    }
    if (bVar4) {
      return;
    }
    compress(ctx->state,ctx->buffer);
    ctx->count = ctx->count + 1;
  }
  for (; 0x7f < len; len = len - 0x80) {
    compress(ctx->state,data);
    ctx->count = ctx->count + 1;
    data = data + 0x80;
  }
  memcpy(ctx->buffer,data,len);
  ctx->fill = len;
  return;
}

Assistant:

void
sha512_add(struct sha512 *ctx, const uint8_t *data, size_t len)
{
	if (ctx->fill > 0) {
		/* fill internal buffer up and compress */
		while (ctx->fill < SHA512_BLOCK_SIZE && len > 0) {
			ctx->buffer[ctx->fill++] = *data++;
			len--;
		}
		if (ctx->fill < SHA512_BLOCK_SIZE)
			return;

		compress(ctx->state, ctx->buffer);
		ctx->count++;
	}

	/* ctx->fill is now zero */

	while (len >= SHA512_BLOCK_SIZE) {
		compress(ctx->state, data);
		ctx->count++;
		
		data += SHA512_BLOCK_SIZE;
		len -= SHA512_BLOCK_SIZE;
	}

	/* save rest for next time */
	memcpy(ctx->buffer, data, len);
	ctx->fill = len;
}